

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeSpirVAssemblySource(qpTestLog *log,char *source)

{
  deBool dVar1;
  bool *elementContent;
  
  elementContent = glcts::fixed_sample_locations_values + 1;
  if ((log->flags & 2) == 0) {
    elementContent = (bool *)source;
  }
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_writeStringElement(log->writer,"SpirVAssemblySource",elementContent);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_writeSpirVAssemblySource(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_writeSpirVAssemblySource (qpTestLog* log, const char* source)
{
	const char* const	sourceStr	= (log->flags & QP_TEST_LOG_EXCLUDE_SHADER_SOURCES) != 0 ? "" : source;

	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SHADERPROGRAM);

	if (!qpXmlWriter_writeStringElement(log->writer, "SpirVAssemblySource", sourceStr))
	{
		qpPrintf("qpTestLog_writeSpirVAssemblySource(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}